

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGhsMultiGenerator::EnableLanguage
          (cmGlobalGhsMultiGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *l,cmMakefile *mf,bool optional)

{
  cmMakefile *pcVar1;
  char *pcVar2;
  string *psVar3;
  allocator<char> local_129;
  string local_128;
  allocator<char> local_101;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  char *local_90;
  char *tgtPlatform;
  string local_80;
  allocator<char> local_49;
  string local_48;
  byte local_21;
  cmMakefile *pcStack_20;
  bool optional_local;
  cmMakefile *mf_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *l_local;
  cmGlobalGhsMultiGenerator *this_local;
  
  local_21 = optional;
  pcStack_20 = mf;
  mf_local = (cmMakefile *)l;
  l_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,"CMAKE_SYSTEM_NAME",&local_49);
  cmMakefile::AddDefinition(mf,&local_48,"GHS-MULTI");
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  pcVar1 = pcStack_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,"GHSMULTI",(allocator<char> *)((long)&tgtPlatform + 7));
  cmMakefile::AddDefinition(pcVar1,&local_80,"1");
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)((long)&tgtPlatform + 7));
  pcVar1 = pcStack_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"GHS_TARGET_PLATFORM",&local_b1);
  pcVar2 = cmMakefile::GetDefinition(pcVar1,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  local_90 = pcVar2;
  if (pcVar2 == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,
               "Green Hills MULTI: GHS_TARGET_PLATFORM not specified; defaulting to \"integrity\"",
               &local_d9);
    cmSystemTools::Message(&local_d8,(char *)0x0);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator(&local_d9);
    local_90 = "integrity";
  }
  pcVar1 = pcStack_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"GHS_TARGET_PLATFORM",&local_101);
  cmMakefile::AddCacheDefinition
            (pcVar1,&local_100,local_90,"Name of GHS target platform.",STRING,false);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  pcVar1 = pcStack_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"GHS_OS_DIR",&local_129);
  psVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_128);
  std::__cxx11::string::operator=((string *)&this->OsDir,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  cmGlobalGenerator::EnableLanguage
            (&this->super_cmGlobalGenerator,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)mf_local,pcStack_20,(bool)(local_21 & 1));
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::EnableLanguage(
  std::vector<std::string> const& l, cmMakefile* mf, bool optional)
{
  mf->AddDefinition("CMAKE_SYSTEM_NAME", "GHS-MULTI");

  mf->AddDefinition("GHSMULTI", "1"); // identifier for user CMake files

  const char* tgtPlatform = mf->GetDefinition("GHS_TARGET_PLATFORM");
  if (!tgtPlatform) {
    cmSystemTools::Message("Green Hills MULTI: GHS_TARGET_PLATFORM not "
                           "specified; defaulting to \"integrity\"");
    tgtPlatform = "integrity";
  }

  /* store the platform name for later use */
  mf->AddCacheDefinition("GHS_TARGET_PLATFORM", tgtPlatform,
                         "Name of GHS target platform.", cmStateEnums::STRING);

  /* store original OS location */
  this->OsDir = mf->GetSafeDefinition("GHS_OS_DIR");

  this->cmGlobalGenerator::EnableLanguage(l, mf, optional);
}